

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SSVectorBase<double> *z,SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2,
          SSVectorBase<double> *rhs3)

{
  double *idx3;
  double *rhs3_00;
  element_type *this_00;
  double *rhs2_00;
  double *rn2;
  double *vec3;
  double *rn3;
  SSVectorBase<double> *this_01;
  double *ridx;
  double *rhs;
  double *vec;
  int *eps;
  CLUFactor<double> *this_02;
  SSVectorBase<double> *in_RCX;
  SSVectorBase<double> *in_RDX;
  SSVectorBase<double> *in_RSI;
  long in_RDI;
  int *ridx2;
  double epsilon;
  int *sidx;
  double *svec;
  int n3;
  int n2;
  int n1;
  CLUFactor<double> *in_stack_fffffffffffffe98;
  int n;
  SSVectorBase<double> *in_stack_fffffffffffffea0;
  SVectorBase<double> *in_stack_fffffffffffffec8;
  SSVectorBase<double> *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffee8;
  int local_6c;
  int local_68;
  int local_64;
  SSVectorBase<double> *local_50;
  SSVectorBase<double> *local_48;
  SSVectorBase<double> *local_40;
  
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x18))();
  idx3 = SSVectorBase<double>::altValues(in_stack_fffffffffffffea0);
  rhs3_00 = (double *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffea0);
  CLUFactor<double>::tolerances(in_stack_fffffffffffffe98);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x28ad20);
  ridx2 = (int *)Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x28ad40);
  SSVectorBase<double>::clear(in_stack_fffffffffffffea0);
  SSVectorBase<double>::clear(in_stack_fffffffffffffea0);
  SSVectorBase<double>::clear(in_stack_fffffffffffffea0);
  SSVectorBase<double>::assign<double>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_64 = SSVectorBase<double>::size((SSVectorBase<double> *)0x28ada9);
  local_68 = SSVectorBase<double>::size((SSVectorBase<double> *)0x28adbd);
  local_6c = SSVectorBase<double>::size((SSVectorBase<double> *)0x28add1);
  rhs2_00 = (double *)(in_RDI + 0x10);
  rn2 = SSVectorBase<double>::altValues(in_stack_fffffffffffffea0);
  vec3 = (double *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffea0);
  rn3 = SSVectorBase<double>::altValues(in_stack_fffffffffffffea0);
  this_01 = (SSVectorBase<double> *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffea0);
  ridx = SSVectorBase<double>::altValues(in_stack_fffffffffffffea0);
  rhs = (double *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffea0);
  vec = SSVectorBase<double>::altValues(in_stack_fffffffffffffea0);
  eps = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffea0);
  this_02 = (CLUFactor<double> *)SSVectorBase<double>::altValues(in_stack_fffffffffffffea0);
  SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffea0);
  CLUFactor<double>::vSolveLeft3sparse
            (this_02,(double)eps,vec,&local_68,rhs,(int *)ridx,(int *)this_01,(double *)&local_6c,
             in_stack_fffffffffffffee8,rhs2_00,ridx2,(int *)rn2,vec3,(int *)idx3,rhs3_00,
             (int *)this_02,(int *)rn3);
  n = (int)((ulong)rn3 >> 0x20);
  SSVectorBase<double>::setSize(this_01,n);
  SSVectorBase<double>::setSize(this_01,n);
  SSVectorBase<double>::setSize(this_01,n);
  if (0 < local_64) {
    SSVectorBase<double>::forceSetup(local_40);
  }
  if (0 < local_68) {
    SSVectorBase<double>::forceSetup(local_48);
  }
  if (0 < local_6c) {
    SSVectorBase<double>::forceSetup(local_50);
  }
  SSVectorBase<double>::setSize(this_01,n);
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 0x278));
  *(int *)(in_RDI + 0x394) = *(int *)(in_RDI + 0x394) + 3;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   SSVectorBase<R>&       z,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2,
   SSVectorBase<R>&       rhs3)
{

   solveTime->start();

   int   n1, n2, n3;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   z.clear();
   ssvec.assign(rhs1);
   n1 = ssvec.size(); // see altValues();
   n2 = rhs2.size();
   n3 = rhs3.size();
   this->vSolveLeft3sparse(epsilon,
                           x.altValues(), x.altIndexMem(),
                           svec, sidx, n1,
                           y.altValues(), y.altIndexMem(),
                           rhs2.altValues(), rhs2.altIndexMem(), n2,
                           z.altValues(), z.altIndexMem(),
                           rhs3.altValues(), rhs3.altIndexMem(), n3);
   x.setSize(n1);
   y.setSize(n2);
   z.setSize(n3);

   if(n1 > 0)
      x.forceSetup();

   if(n2 > 0)
      y.forceSetup();

   if(n3 > 0)
      z.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}